

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

ostream * doctest::operator<<(ostream *stream,String *in)

{
  char *pcVar1;
  String *in_local;
  ostream *stream_local;
  
  pcVar1 = String::c_str(in);
  std::operator<<(stream,pcVar1);
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, const String& in) {
    stream << in.c_str();
    return stream;
}